

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O3

void __thiscall Regex::backtrackGroups(Regex *this,ParseData *data)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  GroupData *pGVar7;
  long lVar8;
  int iVar9;
  
  uVar5 = (this->mGroups).mSize;
  if (0 < (int)uVar5) {
    pGVar7 = (this->mGroups).mData;
    iVar3 = data->cur_pos;
    lVar4 = 0;
    lVar8 = 0;
    do {
      iVar1 = *(int *)((long)&pGVar7->end_pos + lVar4);
      iVar9 = iVar1 - iVar3;
      if (iVar9 != 0 && iVar3 <= iVar1) {
        uVar2 = *(ulong *)((long)&(pGVar7->string)._M_string_length + lVar4);
        lVar6 = uVar2 - (long)iVar9;
        if (uVar2 < (ulong)(long)iVar9) {
          std::__throw_out_of_range_fmt("%s: __pos (which is %zu) > this->size() (which is %zu)");
          if ((getData[abi:cxx11](int)::null_string_abi_cxx11_ == '\0') &&
             (iVar3 = __cxa_guard_acquire(&getData[abi:cxx11](int)::null_string_abi_cxx11_),
             iVar3 != 0)) {
            getData[abi:cxx11](int)::null_string_abi_cxx11_._M_dataplus._M_p =
                 (pointer)&getData[abi:cxx11](int)::null_string_abi_cxx11_.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&getData[abi:cxx11](int)::null_string_abi_cxx11_,"");
            __cxa_atexit(std::__cxx11::string::~string,
                         &getData[abi:cxx11](int)::null_string_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&getData[abi:cxx11](int)::null_string_abi_cxx11_);
          }
          return;
        }
        *(long *)((long)&(pGVar7->string)._M_string_length + lVar4) = lVar6;
        *(undefined1 *)(*(long *)((long)&(pGVar7->string)._M_dataplus._M_p + lVar4) + lVar6) = 0;
        iVar3 = data->cur_pos;
        uVar5 = (this->mGroups).mSize;
        pGVar7 = (this->mGroups).mData;
        *(int *)((long)&pGVar7->end_pos + lVar4) = iVar3;
      }
      lVar8 = lVar8 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar8 < (int)uVar5);
  }
  return;
}

Assistant:

void	Regex::backtrackGroups( ParseData *data )
{
	for ( int i = 0; i < (int)mGroups.size(); i++ )
	{
		if ( mGroups[ i ].end_pos > data->cur_pos )
		{
			std::string &s = mGroups[ i ].string;
			s.erase( s.length() - ( mGroups[ i ].end_pos - data->cur_pos ) );
			mGroups[ i ].end_pos = data->cur_pos;
		}
	}
}